

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_set_focus(nk_context *ctx,char *name)

{
  int len;
  nk_hash hash;
  nk_window *win_00;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  char *name_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4a95,"void nk_window_set_focus(struct nk_context *, const char *)");
  }
  if (ctx != (nk_context *)0x0) {
    len = nk_strlen(name);
    hash = nk_murmur_hash(name,len,0x40);
    win_00 = nk_find_window(ctx,hash,name);
    if ((win_00 != (nk_window *)0x0) && (ctx->end != win_00)) {
      nk_remove_window(ctx,win_00);
      nk_insert_window(ctx,win_00,NK_INSERT_BACK);
    }
    ctx->active = win_00;
  }
  return;
}

Assistant:

NK_API void
nk_window_set_focus(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (win && ctx->end != win) {
        nk_remove_window(ctx, win);
        nk_insert_window(ctx, win, NK_INSERT_BACK);
    }
    ctx->active = win;
}